

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O0

int sf_parser_param(sf_parser *sfp,sf_vec *dest_key,sf_value *dest_value)

{
  uint uVar1;
  int iVar2;
  sf_parser *in_RDX;
  sf_parser *in_RSI;
  sf_parser *in_RDI;
  int rv;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = in_RDI->state & 3;
  if (uVar1 == 0) {
    iVar2 = parser_skip_inner_list
                      ((sf_parser *)
                       (CONCAT44(in_stack_ffffffffffffffdc,in_RDI->state) & 0xffffffff00000003));
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else if (uVar1 != 1) {
    if (uVar1 != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                    ,0x283,"int sf_parser_param(sf_parser *, sf_vec *, sf_value *)");
    }
    goto LAB_00128caf;
  }
  parser_set_op_state(in_RDI,2);
LAB_00128caf:
  iVar2 = parser_eof(in_RDI);
  if ((iVar2 == 0) && (*in_RDI->pos == ';')) {
    in_RDI->pos = in_RDI->pos + 1;
    parser_discard_sp(in_RDX);
    iVar2 = parser_eof(in_RDI);
    if (iVar2 == 0) {
      iVar2 = parser_key((sf_parser *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (sf_vec *)in_RDI);
      if (iVar2 == 0) {
        iVar2 = parser_eof(in_RDI);
        if ((iVar2 == 0) && (*in_RDI->pos == '=')) {
          in_RDI->pos = in_RDI->pos + 1;
          iVar2 = parser_eof(in_RDI);
          if (iVar2 == 0) {
            iVar2 = parser_bare_item(in_RSI,(sf_value *)in_RDX);
          }
          else {
            iVar2 = -1;
          }
        }
        else {
          if (in_RDX != (sf_parser *)0x0) {
            *(undefined4 *)&in_RDX->pos = 0;
            *(undefined4 *)((long)&in_RDX->pos + 4) = 0;
            *(undefined4 *)&in_RDX->end = 1;
          }
          iVar2 = 0;
        }
      }
    }
    else {
      iVar2 = -1;
    }
  }
  else {
    parser_set_op_state(in_RDI,3);
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int sf_parser_param(sf_parser *sfp, sf_vec *dest_key, sf_value *dest_value) {
  int rv;

  switch (sfp->state & SF_STATE_OP_MASK) {
  case SF_STATE_BEFORE:
    rv = parser_skip_inner_list(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_BEFORE_PARAMS:
    parser_set_op_state(sfp, SF_STATE_PARAMS);

    break;
  case SF_STATE_PARAMS:
    break;
  default:
    assert(0);
    abort();
  }

  if (parser_eof(sfp) || *sfp->pos != ';') {
    parser_set_op_state(sfp, SF_STATE_AFTER);

    return SF_ERR_EOF;
  }

  ++sfp->pos;

  parser_discard_sp(sfp);
  if (parser_eof(sfp)) {
    return SF_ERR_PARSE_ERROR;
  }

  rv = parser_key(sfp, dest_key);
  if (rv != 0) {
    return rv;
  }

  if (parser_eof(sfp) || *sfp->pos != '=') {
    if (dest_value) {
      dest_value->type = SF_TYPE_BOOLEAN;
      dest_value->flags = SF_VALUE_FLAG_NONE;
      dest_value->boolean = 1;
    }

    return 0;
  }

  ++sfp->pos;

  if (parser_eof(sfp)) {
    return SF_ERR_PARSE_ERROR;
  }

  return parser_bare_item(sfp, dest_value);
}